

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

int arkStep_CheckButcherTables(ARKodeMem ark_mem)

{
  double *pdVar1;
  uint uVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int error_code;
  ulong uVar8;
  char *msgfmt;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  pvVar3 = ark_mem->step_mem;
  if (pvVar3 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar7 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar6 = 0x917;
    goto LAB_001208f1;
  }
  iVar6 = *(int *)((long)pvVar3 + 0x1c);
  if ((iVar6 != 0) && (*(long *)((long)pvVar3 + 0x68) == 0)) {
    msgfmt = "explicit table is NULL!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x920;
    goto LAB_001208f1;
  }
  iVar7 = *(int *)((long)pvVar3 + 0x20);
  if ((iVar7 != 0) && (*(long *)((long)pvVar3 + 0x70) == 0)) {
    msgfmt = "implicit table is NULL!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x927;
    goto LAB_001208f1;
  }
  uVar2 = *(uint *)((long)pvVar3 + 100);
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    msgfmt = "stages < 1!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x92f;
    goto LAB_001208f1;
  }
  if (*(int *)((long)pvVar3 + 0x58) < 1) {
    msgfmt = "method order < 1!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x937;
    goto LAB_001208f1;
  }
  if ((*(int *)((long)pvVar3 + 0x5c) < 1) && (ark_mem->fixedstep == 0)) {
    msgfmt = "embedding order < 1!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x93f;
    goto LAB_001208f1;
  }
  if ((*(int *)((long)pvVar3 + 0x5c) < 1) || (ark_mem->fixedstep != 0)) {
LAB_001204da:
    if (iVar6 != 0) {
      uVar9 = 1;
      if (1 < (int)uVar2) {
        uVar9 = (ulong)uVar2;
      }
      bVar4 = true;
      uVar11 = 0;
      do {
        uVar14 = uVar11;
        bVar5 = bVar4;
        do {
          bVar4 = false;
          if (ABS(*(double *)
                   (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x10) + uVar11 * 8) +
                   uVar14 * 8)) <= 2.220446049250313e-14) {
            bVar4 = bVar5;
          }
          uVar14 = uVar14 + 1;
          bVar5 = bVar4;
        } while (uVar14 < uVar8);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar9);
      if (!bVar4) {
        msgfmt = "Ae Butcher table is implicit!";
        iVar7 = -0x29;
        error_code = -0x29;
        iVar6 = 0x968;
        goto LAB_001208f1;
      }
    }
  }
  else {
    if ((iVar7 != 0) && (*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x28) == 0)) {
      msgfmt = "no implicit embedding!";
      iVar7 = -0x29;
      error_code = -0x29;
      iVar6 = 0x94b;
      goto LAB_001208f1;
    }
    if (iVar6 != 0) {
      if (*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x28) == 0) {
        msgfmt = "no explicit embedding!";
        iVar7 = -0x29;
        error_code = -0x29;
        iVar6 = 0x954;
        goto LAB_001208f1;
      }
      goto LAB_001204da;
    }
  }
  if (iVar7 != 0) {
    uVar9 = 1;
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    uVar11 = 0;
    bVar4 = false;
    do {
      bVar5 = true;
      if (ABS(*(double *)
               (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x10) + uVar11 * 8) +
               uVar11 * 8)) <= 2.220446049250313e-14) {
        bVar5 = bVar4;
      }
      uVar11 = uVar11 + 1;
      bVar4 = bVar5;
    } while (uVar9 != uVar11);
    if (!bVar5) {
      msgfmt = "Ai Butcher table is explicit!";
      iVar7 = -0x29;
      error_code = -0x29;
      iVar6 = 0x978;
      goto LAB_001208f1;
    }
    uVar9 = 1;
    if (1 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    bVar4 = true;
    lVar10 = 0;
    uVar11 = uVar8;
    uVar14 = 0;
    do {
      uVar13 = uVar14 + 1;
      if (uVar13 < uVar8) {
        uVar12 = 1;
        bVar5 = bVar4;
        do {
          bVar4 = false;
          if (ABS(*(double *)
                   (*(long *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x10) + uVar14 * 8) +
                    lVar10 + uVar12 * 8)) <= 2.220446049250313e-14) {
            bVar4 = bVar5;
          }
          uVar12 = uVar12 + 1;
          bVar5 = bVar4;
        } while (uVar11 != uVar12);
      }
      lVar10 = lVar10 + 8;
      uVar11 = uVar11 - 1;
      uVar14 = uVar13;
    } while (uVar13 != uVar9);
    if (!bVar4) {
      msgfmt = "Ai Butcher table has entries above diagonal!";
      iVar7 = -0x29;
      error_code = -0x29;
      iVar6 = 0x987;
      goto LAB_001208f1;
    }
  }
  if (ark_mem->relax_enabled == 0) {
    return 0;
  }
  if (*(int *)((long)pvVar3 + 0x58) == 1) {
    msgfmt = "The Butcher table(s) must be at least second order!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x992;
  }
  else {
    if (iVar6 != 0) {
      uVar8 = 1;
      if (1 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      uVar9 = 0;
      do {
        pdVar1 = (double *)(*(long *)(*(long *)((long)pvVar3 + 0x68) + 0x20) + uVar9 * 8);
        if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
          msgfmt = "The explicit Butcher table has a negative b value!";
          iVar7 = -0x29;
          error_code = -0x29;
          iVar6 = 0x99e;
          goto LAB_001208f1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (iVar7 == 0) {
      return 0;
    }
    uVar8 = 1;
    if (1 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    uVar9 = 0;
    while (pdVar1 = (double *)(*(long *)(*(long *)((long)pvVar3 + 0x70) + 0x20) + uVar9 * 8),
          0.0 < *pdVar1 || *pdVar1 == 0.0) {
      uVar9 = uVar9 + 1;
      if (uVar8 == uVar9) {
        return 0;
      }
    }
    msgfmt = "The implicit Butcher table has a negative b value!";
    iVar7 = -0x29;
    error_code = -0x29;
    iVar6 = 0x9ad;
  }
LAB_001208f1:
  arkProcessError(ark_mem,error_code,iVar6,"arkStep_CheckButcherTables",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                  ,msgfmt);
  return iVar7;
}

Assistant:

int arkStep_CheckButcherTables(ARKodeMem ark_mem)
{
  int i, j;
  sunbooleantype okay;
  ARKodeARKStepMem step_mem;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* check that the expected tables are set */
  if (step_mem->explicit && step_mem->Be == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "explicit table is NULL!");
    return (ARK_INVALID_TABLE);
  }

  if (step_mem->implicit && step_mem->Bi == NULL)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "implicit table is NULL!");
    return (ARK_INVALID_TABLE);
  }

  /* check that stages > 0 */
  if (step_mem->stages < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "stages < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->q < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "method order < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 */
  if ((step_mem->p < 1) && (!ark_mem->fixedstep))
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "embedding order < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding exists */
  if ((step_mem->p > 0) && (!ark_mem->fixedstep))
  {
    if (step_mem->implicit)
    {
      if (step_mem->Bi->d == NULL)
      {
        arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                        __FILE__, "no implicit embedding!");
        return (ARK_INVALID_TABLE);
      }
    }
    if (step_mem->explicit)
    {
      if (step_mem->Be->d == NULL)
      {
        arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                        __FILE__, "no explicit embedding!");
        return (ARK_INVALID_TABLE);
      }
    }
  }

  /* check that ERK table is strictly lower triangular */
  if (step_mem->explicit)
  {
    okay = SUNTRUE;
    for (i = 0; i < step_mem->stages; i++)
    {
      for (j = i; j < step_mem->stages; j++)
      {
        if (SUNRabs(step_mem->Be->A[i][j]) > tol) { okay = SUNFALSE; }
      }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ae Butcher table is implicit!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* check that IRK table is implicit and lower triangular */
  if (step_mem->implicit)
  {
    okay = SUNFALSE;
    for (i = 0; i < step_mem->stages; i++)
    {
      if (SUNRabs(step_mem->Bi->A[i][i]) > tol) { okay = SUNTRUE; }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ai Butcher table is explicit!");
      return (ARK_INVALID_TABLE);
    }

    okay = SUNTRUE;
    for (i = 0; i < step_mem->stages; i++)
    {
      for (j = i + 1; j < step_mem->stages; j++)
      {
        if (SUNRabs(step_mem->Bi->A[i][j]) > tol) { okay = SUNFALSE; }
      }
    }
    if (!okay)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Ai Butcher table has entries above diagonal!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check if the method is compatible with relaxation */
  if (ark_mem->relax_enabled)
  {
    if (step_mem->q < 2)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "The Butcher table(s) must be at least second order!");
      return ARK_INVALID_TABLE;
    }

    if (step_mem->explicit)
    {
      /* Check if all b values are positive */
      for (i = 0; i < step_mem->stages; i++)
      {
        if (step_mem->Be->b[i] < ZERO)
        {
          arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                          __FILE__,
                          "The explicit Butcher table has a negative b value!");
          return ARK_INVALID_TABLE;
        }
      }
    }

    if (step_mem->implicit)
    {
      /* Check if all b values are positive */
      for (i = 0; i < step_mem->stages; i++)
      {
        if (step_mem->Bi->b[i] < ZERO)
        {
          arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__,
                          __FILE__,
                          "The implicit Butcher table has a negative b value!");
          return ARK_INVALID_TABLE;
        }
      }
    }
  }

  return (ARK_SUCCESS);
}